

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFunctionLibrary.cpp
# Opt level: O3

void __thiscall
tcu::StaticFunctionLibrary::StaticFunctionLibrary
          (StaticFunctionLibrary *this,Entry *entries,int numEntries)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  allocator<char> local_79;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>
  local_58;
  
  (this->super_FunctionLibrary)._vptr_FunctionLibrary =
       (_func_int **)&PTR__StaticFunctionLibrary_002748a8;
  p_Var1 = &(this->m_functions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (0 < numEntries) {
    paVar2 = &local_58.first.field_2;
    lVar3 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,*(char **)((long)&entries->name + lVar3),&local_79);
      if (local_78 == &local_68) {
        local_58.first.field_2._8_8_ = local_68._8_8_;
        local_58.first._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_58.first._M_dataplus._M_p = (pointer)local_78;
      }
      local_58.first.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
      local_58.first.field_2._M_local_buf[0] = local_68._M_local_buf[0];
      local_58.first._M_string_length = local_70;
      local_70 = 0;
      local_68._M_local_buf[0] = '\0';
      local_58.second = *(_func_void **)((long)&entries->ptr + lVar3);
      local_78 = &local_68;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,void(*)()>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
                  *)&this->m_functions,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(local_68._M_allocated_capacity._1_7_,
                                          local_68._M_local_buf[0]) + 1);
      }
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)numEntries << 4 != lVar3);
  }
  return;
}

Assistant:

StaticFunctionLibrary::StaticFunctionLibrary (const Entry* entries, int numEntries)
{
	for (int entryNdx = 0; entryNdx < numEntries; entryNdx++)
		m_functions.insert(std::make_pair(std::string(entries[entryNdx].name), entries[entryNdx].ptr));
}